

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::init(RobustnessTestCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 err;
  Visibility VVar1;
  int iVar2;
  EGLDisplay pvVar3;
  FilterList *this_00;
  Library *pLVar4;
  EGLConfig pvVar5;
  NativeWindowFactory *pNVar6;
  undefined4 extraout_var;
  EGLSurface pvVar7;
  FilterList filters;
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  local_38;
  
  pvVar3 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar3;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = eglu::FilterList::operator<<((FilterList *)&local_38,isWindow);
  eglu::FilterList::operator<<(this_00,egl::(anonymous_namespace)::renderable<64u>);
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::chooseSingleConfig(pLVar4,this->m_eglDisplay,(FilterList *)&local_38);
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base(&local_38);
  this->m_eglConfig = pvVar5;
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  (**pLVar4->_vptr_Library)(pLVar4,0x30a0);
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  err = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  eglu::checkError(err,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                   ,0x1af);
  pNVar6 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  VVar1 = eglu::parseWindowVisibility
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000100;
  local_38._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_38._M_impl.super__Vector_impl_data._M_finish._4_4_,VVar1);
  iVar2 = (*(pNVar6->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar6,(((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                            super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                            .m_data.ptr,this->m_eglDisplay,this->m_eglConfig,0,&local_38);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar2);
  pvVar7 = eglu::createWindowSurface
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar2),this->m_eglDisplay,
                      this->m_eglConfig,(EGLAttrib *)0x0);
  this->m_eglSurface = pvVar7;
  return (int)pvVar7;
}

Assistant:

void RobustnessTestCase::init (void)
{
	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= getEGLConfig();

	initEGLSurface();
}